

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void __thiscall FM::OPNABase::SetADPCMBReg(OPNABase *this,uint addr,uint data)

{
  uint uVar1;
  uint8 uVar2;
  
  uVar2 = (uint8)data;
  switch(addr) {
  case 0:
    if (((char)uVar2 < '\0') && (this->adpcmplay == false)) {
      this->adpcmplay = true;
      this->memaddr = this->startaddr;
      this->adpcmx = 0;
      this->adpcmd = 0x7f;
      this->adplc = 0;
    }
    if ((data & 1) != 0) {
      this->adpcmplay = false;
    }
    this->control1 = uVar2;
    return;
  case 1:
    this->control2 = uVar2;
    this->granuality = ((data & 2) == 0) * '\x03' + '\x01';
    return;
  case 2:
  case 3:
    this->adpcmreg[addr - 2] = uVar2;
    uVar1 = (uint)this->adpcmreg[0] << 6 | (uint)this->adpcmreg[1] << 0xe;
    this->startaddr = uVar1;
    this->memaddr = uVar1;
    return;
  case 4:
  case 5:
    this->adpcmreg[addr - 2] = uVar2;
    this->stopaddr = (uint)this->adpcmreg[3] * 0x4000 + (uint)this->adpcmreg[2] * 0x40 + 0x40;
    return;
  case 8:
    if ((~this->control1 & 0x60) == 0) {
      WriteRAM(this,data);
      return;
    }
    break;
  case 9:
  case 10:
    this->adpcmreg[addr - 5] = uVar2;
    uVar1 = 0x100;
    if (0x100 < *(ushort *)(this->adpcmreg + 4)) {
      uVar1 = (uint)*(ushort *)(this->adpcmreg + 4);
    }
    this->deltan = uVar1;
    this->adpld = uVar1 * this->adplbase >> 0x10;
    return;
  case 0xb:
    this->adpcmlevel = data;
    this->adpcmvolume = (int)(data * this->adpcmvol) >> 0xc;
    return;
  case 0xc:
  case 0xd:
    this->adpcmreg[addr - 6] = uVar2;
    this->limitaddr = (uint)this->adpcmreg[7] * 0x4000 + (uint)this->adpcmreg[6] * 0x40 + 0x40;
    return;
  case 0x10:
    if ((char)uVar2 < '\0') {
      (this->super_OPNBase).status = 0;
      (*(this->super_OPNBase).super_Timer._vptr_Timer[4])(this,0);
      return;
    }
    this->stmask = ~data | 0xffffffe0;
  }
  return;
}

Assistant:

void OPNABase::SetADPCMBReg(uint addr, uint data)
{
	switch (addr)
	{
	case 0x00:		// Control Register 1
		if ((data & 0x80) && !adpcmplay)
		{
			adpcmplay = true;
			memaddr = startaddr;
			adpcmx = 0, adpcmd = 127;
			adplc = 0;
		}
		if (data & 1)
		{
			adpcmplay = false;
		}
		control1 = data;
		break;

	case 0x01:		// Control Register 2
		control2 = data;
		granuality = control2 & 2 ? 1 : 4;
		break;

	case 0x02:		// Start Address L
	case 0x03:		// Start Address H
		adpcmreg[addr - 0x02 + 0] = data;
		startaddr = (adpcmreg[1]*256+adpcmreg[0]) << 6;
		memaddr = startaddr;
//		LOG1("  startaddr %.6x", startaddr);
		break;

	case 0x04:		// Stop Address L
	case 0x05:		// Stop Address H
		adpcmreg[addr - 0x04 + 2] = data;
		stopaddr = (adpcmreg[3]*256+adpcmreg[2] + 1) << 6;
//		LOG1("  stopaddr %.6x", stopaddr);
		break;

	case 0x08:		// ADPCM data
		if ((control1 & 0x60) == 0x60)
		{
//			LOG2("  Wr [0x%.5x] = %.2x", memaddr, data);
			WriteRAM(data);
		}
		break;

	case 0x09:		// delta-N L
	case 0x0a:		// delta-N H
		adpcmreg[addr - 0x09 + 4] = data;
		deltan = adpcmreg[5]*256+adpcmreg[4];
		deltan = Max(256, deltan);
		adpld = deltan * adplbase >> 16;
		break;

	case 0x0b:		// Level Control
		adpcmlevel = data;
		adpcmvolume = (adpcmvol * adpcmlevel) >> 12;
		break;

	case 0x0c:		// Limit Address L
	case 0x0d:		// Limit Address H
		adpcmreg[addr - 0x0c + 6] = data;
		limitaddr = (adpcmreg[7]*256+adpcmreg[6] + 1) << 6;
//		LOG1("  limitaddr %.6x", limitaddr);
		break;

	case 0x10:		// Flag Control
		if (data & 0x80)
		{
			status = 0;
			UpdateStatus();
		}
		else
		{
			stmask = ~(data & 0x1f);
//			UpdateStatus();					//???
		}
		break;
	}
}